

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamFormatPrinter_p.cpp
# Opt level: O3

string * __thiscall
BamTools::Internal::SamFormatPrinter::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SamFormatPrinter *this)

{
  stringstream out;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  stringstream local_1a0 [128];
  ios_base local_120 [264];
  
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"");
  std::__cxx11::stringstream::stringstream(local_1a0,(string *)local_1c0,_S_out|_S_in);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  PrintHD(this,(stringstream *)local_1a0);
  PrintSQ(this,(stringstream *)local_1a0);
  PrintRG(this,(stringstream *)local_1a0);
  PrintPG(this,(stringstream *)local_1a0);
  PrintCO(this,(stringstream *)local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

const string SamFormatPrinter::ToString(void) const {

    // clear out stream
    stringstream out("");

    // generate formatted header text
    PrintHD(out);
    PrintSQ(out);
    PrintRG(out);
    PrintPG(out);
    PrintCO(out);

    // return result
    return out.str();
}